

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * Cudd_addVectorCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  int *piVar1;
  int iVar2;
  DdHashTable *table;
  DdNode *pDVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint deepest;
  
  do {
    dd->reordered = 0;
    table = cuddHashTableInit(dd,1,2);
    if (table == (DdHashTable *)0x0) goto LAB_0065aa20;
    uVar4 = dd->size;
    uVar5 = (int)uVar4 >> 0x1f & uVar4;
    uVar6 = uVar4;
    do {
      uVar4 = uVar4 - 1;
      deepest = uVar5 - 1;
      if ((int)uVar6 < 1) break;
      iVar2 = ddIsIthAddVar(dd,vector[dd->invperm[uVar4]],dd->invperm[uVar4]);
      deepest = uVar6 - 1;
      uVar6 = deepest;
    } while (iVar2 != 0);
    pDVar3 = cuddAddVectorComposeRecur(dd,table,f,vector,deepest);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    cuddHashTableQuit(table);
  } while (dd->reordered == 1);
  if (pDVar3 == (DdNode *)0x0) {
LAB_0065aa20:
    pDVar3 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addVectorCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdHashTable         *table;
    DdNode              *res;
    int                 deepest;
    int                 i;

    do {
        dd->reordered = 0;
        /* Initialize local cache. */
        table = cuddHashTableInit(dd,1,2);
        if (table == NULL) return(NULL);

        /* Find deepest real substitution. */
        for (deepest = dd->size - 1; deepest >= 0; deepest--) {
            i = dd->invperm[deepest];
            if (!ddIsIthAddVar(dd,vector[i],i)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        res = cuddAddVectorComposeRecur(dd,table,f,vector,deepest);
        if (res != NULL) cuddRef(res);

        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (dd->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}